

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::D_formatter<spdlog::details::scoped_padder>::format
          (D_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  size_t sVar1;
  byte bVar2;
  buffer<char> *buf;
  uint uVar3;
  ulong uVar4;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  scoped_padder p;
  uint local_58 [4];
  scoped_padder local_48;
  
  scoped_padder::scoped_padder(&local_48,10,&(this->super_flag_formatter).padinfo_,dest);
  uVar3 = tm_time->tm_mon + 1;
  if (uVar3 < 100) {
    sVar1 = (dest->super_buffer<char>).size_;
    uVar4 = sVar1 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar4) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar4);
      sVar1 = (dest->super_buffer<char>).size_;
      uVar4 = sVar1 + 1;
    }
    bVar2 = (byte)((uVar3 & 0xff) / 10);
    (dest->super_buffer<char>).size_ = uVar4;
    (dest->super_buffer<char>).ptr_[sVar1] = bVar2 | 0x30;
    sVar1 = (dest->super_buffer<char>).size_;
    uVar4 = sVar1 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar4) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar4);
      sVar1 = (dest->super_buffer<char>).size_;
      uVar4 = sVar1 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar4;
    (dest->super_buffer<char>).ptr_[sVar1] = (char)uVar3 + bVar2 * -10 | 0x30;
  }
  else {
    fmt.size_ = 5;
    fmt.data_ = "{:02}";
    args.field_1.values_ = (value<fmt::v11::context> *)local_58;
    args.desc_ = 1;
    local_58[0] = uVar3;
    ::fmt::v11::detail::vformat_to(&dest->super_buffer<char>,fmt,args,(locale_ref)0x0);
  }
  sVar1 = (dest->super_buffer<char>).size_;
  uVar4 = sVar1 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar4) {
    (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar4);
    sVar1 = (dest->super_buffer<char>).size_;
    uVar4 = sVar1 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar4;
  (dest->super_buffer<char>).ptr_[sVar1] = '/';
  uVar3 = tm_time->tm_mday;
  if (uVar3 < 100) {
    sVar1 = (dest->super_buffer<char>).size_;
    uVar4 = sVar1 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar4) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar4);
      sVar1 = (dest->super_buffer<char>).size_;
      uVar4 = sVar1 + 1;
    }
    bVar2 = (byte)((uVar3 & 0xff) / 10);
    (dest->super_buffer<char>).size_ = uVar4;
    (dest->super_buffer<char>).ptr_[sVar1] = bVar2 | 0x30;
    sVar1 = (dest->super_buffer<char>).size_;
    uVar4 = sVar1 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar4) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar4);
      sVar1 = (dest->super_buffer<char>).size_;
      uVar4 = sVar1 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar4;
    (dest->super_buffer<char>).ptr_[sVar1] = (char)uVar3 + bVar2 * -10 | 0x30;
  }
  else {
    fmt_00.size_ = 5;
    fmt_00.data_ = "{:02}";
    args_00.field_1.values_ = (value<fmt::v11::context> *)local_58;
    args_00.desc_ = 1;
    local_58[0] = uVar3;
    ::fmt::v11::detail::vformat_to(&dest->super_buffer<char>,fmt_00,args_00,(locale_ref)0x0);
  }
  sVar1 = (dest->super_buffer<char>).size_;
  uVar4 = sVar1 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar4) {
    (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar4);
    sVar1 = (dest->super_buffer<char>).size_;
    uVar4 = sVar1 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar4;
  (dest->super_buffer<char>).ptr_[sVar1] = '/';
  uVar3 = tm_time->tm_year % 100;
  if (uVar3 < 100) {
    sVar1 = (dest->super_buffer<char>).size_;
    uVar4 = sVar1 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar4) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar4);
      sVar1 = (dest->super_buffer<char>).size_;
      uVar4 = sVar1 + 1;
    }
    bVar2 = (byte)((uVar3 & 0xff) / 10);
    (dest->super_buffer<char>).size_ = uVar4;
    (dest->super_buffer<char>).ptr_[sVar1] = bVar2 | 0x30;
    sVar1 = (dest->super_buffer<char>).size_;
    uVar4 = sVar1 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar4) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar4);
      sVar1 = (dest->super_buffer<char>).size_;
      uVar4 = sVar1 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar4;
    (dest->super_buffer<char>).ptr_[sVar1] = (char)uVar3 + bVar2 * -10 | 0x30;
  }
  else {
    fmt_01.size_ = 5;
    fmt_01.data_ = "{:02}";
    args_01.field_1.values_ = (value<fmt::v11::context> *)local_58;
    args_01.desc_ = 1;
    local_58[0] = uVar3;
    ::fmt::v11::detail::vformat_to(&dest->super_buffer<char>,fmt_01,args_01,(locale_ref)0x0);
  }
  scoped_padder::~scoped_padder(&local_48);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 10;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::pad2(tm_time.tm_mon + 1, dest);
        dest.push_back('/');
        fmt_helper::pad2(tm_time.tm_mday, dest);
        dest.push_back('/');
        fmt_helper::pad2(tm_time.tm_year % 100, dest);
    }